

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5IndexFlush(Fts5Index *p)

{
  int *pRc;
  Fts5StructureSegment *pFVar1;
  int iVar2;
  char *pTerm;
  uint uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  u64 v;
  ulong uVar9;
  Fts5Config *pFVar10;
  int iVar11;
  long lVar12;
  u8 *p_00;
  ulong uVar13;
  undefined8 in_R8;
  int iVar14;
  Fts5Structure *pStruct;
  int iVar15;
  uint uVar16;
  Fts5Structure *local_140;
  int pgnoLast;
  Fts5Hash *local_130;
  u8 *local_128;
  ulong local_120;
  i64 iDelta;
  int local_110;
  uint local_10c;
  int local_108;
  int local_104;
  int nDoclist;
  u32 dummy;
  u64 local_f8;
  Fts5Index *local_f0;
  u8 *pDoclist;
  Fts5Structure *local_e0;
  Fts5SegWriter writer;
  char *zTerm;
  int bDummy;
  
  if (p->nPendingData != 0) {
    p->nPendingData = 0;
    local_130 = p->pHash;
    pgnoLast = 0;
    local_140 = fts5StructureRead(p);
    local_e0 = local_140;
    iVar5 = fts5AllocateSegid(p,local_140);
    fts5StructureInvalidate(p);
    if (iVar5 == 0) {
      lVar12 = 0;
    }
    else {
      local_108 = p->pConfig->eDetail;
      iVar15 = p->pConfig->pgsz;
      local_110 = iVar5;
      fts5WriteInit(p,&writer,iVar5);
      pRc = &p->rc;
      iVar5 = p->rc;
      local_f0 = p;
      if (iVar5 == 0) {
        iVar5 = sqlite3Fts5HashScanInit(local_130,(char *)0x0,0);
        *pRc = iVar5;
      }
      while ((iVar11 = (int)in_R8, iVar5 == 0 && (local_130->pScan != (Fts5HashEntry *)0x0))) {
        sqlite3Fts5HashScanEntry(local_130,&zTerm,&pDoclist,&nDoclist);
        pTerm = zTerm;
        sVar8 = strlen(zTerm);
        fts5WriteAppendTerm(p,&writer,(int)sVar8,(u8 *)pTerm);
        iVar2 = nDoclist;
        iVar11 = (int)in_R8;
        if (p->rc != 0) break;
        iVar11 = nDoclist + writer.writer.buf.n;
        if (writer.writer.pgidx.n + iVar11 < iVar15) {
          memcpy(writer.writer.buf.p + writer.writer.buf.n,pDoclist,(long)nDoclist);
          iVar5 = *pRc;
          writer.writer.buf.n = iVar11;
        }
        else {
          iDelta = 0;
          iVar5 = 0;
          local_128 = pDoclist;
          iVar11 = 0;
          local_f8 = 0;
          while ((iVar5 == 0 && (iVar11 < iVar2))) {
            bVar4 = sqlite3Fts5GetVarint(local_128 + iVar11,(u64 *)&iDelta);
            iVar5 = writer.writer.buf.n;
            v = local_f8 + iDelta;
            local_f8 = v;
            if (writer.bFirstRowidInPage == '\0') {
              iVar6 = sqlite3Fts5PutVarint(writer.writer.buf.p + writer.writer.buf.n,iDelta);
              writer.writer.buf.n = iVar6 + iVar5;
            }
            else {
              *writer.writer.buf.p = (u8)((uint)writer.writer.buf.n >> 8);
              writer.writer.buf.p[1] = (u8)writer.writer.buf.n;
              local_120 = CONCAT71(local_120._1_7_,bVar4);
              iVar6 = sqlite3Fts5PutVarint(writer.writer.buf.p + writer.writer.buf.n,v);
              writer.writer.buf.n = iVar6 + iVar5;
              writer.bFirstRowidInPage = '\0';
              bVar4 = (byte)local_120;
              fts5WriteDlidxAppend(p,&writer,v);
              iVar5 = p->rc;
              if (iVar5 != 0) break;
            }
            uVar16 = iVar11 + (uint)bVar4;
            lVar12 = (long)(int)uVar16;
            if (local_108 == 1) {
              if (((int)uVar16 < iVar2) && (local_128[lVar12] == '\0')) {
                uVar9 = (long)writer.writer.buf.n + 1;
                writer.writer.buf.p[writer.writer.buf.n] = '\0';
                uVar13 = lVar12 + 1;
                iVar5 = (int)uVar9;
                if (((int)uVar13 < iVar2) && (local_128[uVar13] == '\0')) {
                  writer.writer.buf.n = writer.writer.buf.n + 2;
                  writer.writer.buf.p[uVar9] = '\0';
                  uVar16 = uVar16 + 2;
                  goto LAB_00195a9b;
                }
              }
              else {
LAB_00195a9b:
                uVar9 = (ulong)(uint)writer.writer.buf.n;
                uVar13 = (ulong)uVar16;
                iVar5 = writer.writer.buf.n;
              }
              writer.writer.buf.n = iVar5;
              iVar11 = (int)uVar13;
              if (iVar15 <= (int)uVar9 + writer.writer.pgidx.n) {
                fts5WriteFlushLeaf(p,&writer);
              }
            }
            else {
              p_00 = local_128 + lVar12;
              local_10c = uVar16;
              iVar5 = fts5GetPoslistSize(p_00,&local_104,&bDummy);
              iVar11 = (int)((long)iVar5 + (long)local_104);
              iVar6 = writer.writer.buf.n + iVar11;
              if (iVar15 < writer.writer.pgidx.n + iVar6) {
                iVar5 = 0;
                do {
                  iVar6 = writer.writer.buf.n;
                  if (*pRc != 0) break;
                  lVar12 = (long)writer.writer.buf.n;
                  local_120 = (ulong)(uint)writer.writer.pgidx.n;
                  iVar14 = iVar15 - (writer.writer.pgidx.n + writer.writer.buf.n);
                  uVar16 = iVar11 - iVar5;
                  if (iVar14 < (int)uVar16) {
                    uVar16 = sqlite3Fts5GetVarint32(p_00 + iVar5,&dummy);
                    if ((int)uVar16 < iVar14) {
                      uVar3 = uVar16;
                      do {
                        uVar16 = uVar3;
                        iVar7 = sqlite3Fts5GetVarint32(p_00 + iVar5 + uVar16,&dummy);
                        uVar3 = iVar7 + uVar16;
                      } while ((int)(iVar7 + uVar16) <= iVar14);
                    }
                  }
                  memcpy(writer.writer.buf.p + lVar12,p_00 + iVar5,(long)(int)uVar16);
                  writer.writer.buf.n = uVar16 + iVar6;
                  if (iVar15 <= writer.writer.buf.n + (int)local_120) {
                    fts5WriteFlushLeaf(local_f0,&writer);
                  }
                  iVar5 = iVar5 + uVar16;
                } while (iVar5 < iVar11);
              }
              else {
                memcpy(writer.writer.buf.p + writer.writer.buf.n,p_00,(long)iVar5 + (long)local_104)
                ;
                writer.writer.buf.n = iVar6;
              }
              iVar11 = local_10c + iVar11;
              p = local_f0;
            }
            iVar5 = *pRc;
          }
        }
        if (iVar5 == 0) {
          local_130->pScan = local_130->pScan->pScanNext;
        }
      }
      sqlite3Fts5HashClear(local_130);
      fts5WriteFinish(p,&writer,&pgnoLast);
      if (local_140->nLevel == 0) {
        fts5StructureAddLevel(pRc,&local_e0);
        local_140 = local_e0;
      }
      fts5StructureExtendLevel(pRc,local_140,0,0,iVar11);
      if (*pRc == 0) {
        pFVar1 = local_140->aLevel[0].aSeg;
        iVar5 = local_140->aLevel[0].nSeg;
        local_140->aLevel[0].nSeg = iVar5 + 1;
        pFVar1[iVar5].iSegid = local_110;
        pFVar1[iVar5].pgnoFirst = 1;
        pFVar1[iVar5].pgnoLast = pgnoLast;
        local_140->nSegment = local_140->nSegment + 1;
      }
      lVar12 = (long)pgnoLast;
      fts5StructurePromote(p,0,local_140);
    }
    pFVar10 = p->pConfig;
    if ((p->rc == 0) && (iVar5 = pFVar10->nAutomerge, 0 < iVar5)) {
      uVar9 = local_140->nWriteCounter;
      uVar13 = lVar12 + uVar9;
      iVar15 = p->nWorkUnit;
      local_140->nWriteCounter = uVar13;
      fts5IndexMerge(p,&local_e0,
                     ((int)(uVar13 / (ulong)(long)iVar15) - (int)(uVar9 / (ulong)(long)iVar15)) *
                     iVar15 * local_140->nLevel,iVar5);
      pFVar10 = p->pConfig;
      local_140 = local_e0;
    }
    iVar5 = pFVar10->nCrisisMerge;
    iVar15 = 1;
    writer._0_8_ = local_140;
    for (lVar12 = 0x1c;
        (p->rc == 0 && (iVar5 <= *(int *)((long)local_140->aLevel + lVar12 + -0x18)));
        lVar12 = lVar12 + 0x10) {
      fts5IndexMergeLevel(p,(Fts5Structure **)&writer,iVar15 + -1,(int *)0x0);
      local_140 = (Fts5Structure *)writer._0_8_;
      fts5StructurePromote(p,iVar15,(Fts5Structure *)writer._0_8_);
      iVar15 = iVar15 + 1;
    }
    fts5StructureWrite(p,local_140);
    fts5StructureRelease(local_140);
  }
  return;
}

Assistant:

static void fts5IndexFlush(Fts5Index *p){
  /* Unless it is empty, flush the hash table to disk */
  if( p->nPendingData ){
    assert( p->pHash );
    p->nPendingData = 0;
    fts5FlushOneHash(p);
  }
}